

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LogStorage::InitializeScanEntries(LogStorage *this,LogStorageScanState *state)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Not implemented for this LogStorage: InitializeScanEntries",
             &local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LogStorage::InitializeScanEntries(LogStorageScanState &state) const {
	throw NotImplementedException("Not implemented for this LogStorage: InitializeScanEntries");
}